

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O2

int Scl_LibertyComputeWorstCase
              (Vec_Ptr_t *vTables,Vec_Flt_t **pvInd0,Vec_Flt_t **pvInd1,Vec_Flt_t **pvValues)

{
  uint uVar1;
  int iVar2;
  Vec_Flt_t *pVVar3;
  Vec_Flt_t *pVVar4;
  Vec_Flt_t *pVVar5;
  Vec_Flt_t *p1;
  Vec_Flt_t *p1_00;
  Vec_Flt_t *p;
  int iVar6;
  long lVar7;
  float fVar8;
  float fVar9;
  
  uVar1 = vTables->nSize;
  if ((0 < (int)uVar1) && (uVar1 % 3 == 0)) {
    pVVar3 = (Vec_Flt_t *)Vec_PtrEntry(vTables,0);
    if (uVar1 - 3 < 3) {
      *pvInd0 = pVVar3;
      pVVar3 = (Vec_Flt_t *)Vec_PtrEntry(vTables,1);
      *pvInd1 = pVVar3;
      pVVar3 = (Vec_Flt_t *)Vec_PtrEntry(vTables,2);
      *pvValues = pVVar3;
      if (vTables->nSize < 0) {
        __assert_fail("p->nSize >= nSizeNew",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x232,"void Vec_PtrShrink(Vec_Ptr_t *, int)");
      }
      vTables->nSize = 0;
    }
    else {
      pVVar3 = Vec_FltDup(pVVar3);
      pVVar4 = (Vec_Flt_t *)Vec_PtrEntry(vTables,1);
      pVVar4 = Vec_FltDup(pVVar4);
      pVVar5 = (Vec_Flt_t *)Vec_PtrEntry(vTables,2);
      pVVar5 = Vec_FltDup(pVVar5);
      for (iVar6 = 1; iVar6 < (int)uVar1 / 3; iVar6 = iVar6 + 1) {
        p1 = (Vec_Flt_t *)Vec_PtrEntry(vTables,iVar6 * 3);
        p1_00 = (Vec_Flt_t *)Vec_PtrEntry(vTables,iVar6 * 3 + 1);
        p = (Vec_Flt_t *)Vec_PtrEntry(vTables,iVar6 * 3 + 2);
        iVar2 = Vec_FltEqual(p1,pVVar3);
        if (iVar2 != 0) {
          iVar2 = Vec_FltEqual(p1_00,pVVar4);
          if (iVar2 != 0) {
            for (lVar7 = 0; lVar7 < p->nSize; lVar7 = lVar7 + 1) {
              fVar8 = Vec_FltEntry(p,(int)lVar7);
              fVar9 = Vec_FltEntry(pVVar5,(int)lVar7);
              if (fVar9 < fVar8) {
                if (pVVar5->nSize <= lVar7) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecFlt.h"
                                ,0x184,"void Vec_FltWriteEntry(Vec_Flt_t *, int, float)");
                }
                pVVar5->pArray[lVar7] = fVar8;
              }
            }
          }
        }
      }
      *pvInd0 = pVVar3;
      *pvInd1 = pVVar4;
      *pvValues = pVVar5;
    }
    return 1;
  }
  __assert_fail("Vec_PtrSize(vTables) > 0 && Vec_PtrSize(vTables) % 3 == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLiberty.c"
                ,0x495,
                "int Scl_LibertyComputeWorstCase(Vec_Ptr_t *, Vec_Flt_t **, Vec_Flt_t **, Vec_Flt_t **)"
               );
}

Assistant:

int Scl_LibertyComputeWorstCase( Vec_Ptr_t * vTables, Vec_Flt_t ** pvInd0, Vec_Flt_t ** pvInd1, Vec_Flt_t ** pvValues )
{
    Vec_Flt_t * vInd0, * vInd1, * vValues;
    Vec_Flt_t * vind0, * vind1, * vvalues;
    int i, k, nTriples = Vec_PtrSize(vTables) / 3;
    float Entry;
    assert( Vec_PtrSize(vTables) > 0 && Vec_PtrSize(vTables) % 3 == 0 );
    if ( nTriples == 1 )
    {
        *pvInd0   = (Vec_Flt_t *)Vec_PtrEntry(vTables, 0);
        *pvInd1   = (Vec_Flt_t *)Vec_PtrEntry(vTables, 1);
        *pvValues = (Vec_Flt_t *)Vec_PtrEntry(vTables, 2);
        Vec_PtrShrink( vTables, 0 );
        return 1;
    }
    vInd0   = Vec_FltDup( (Vec_Flt_t *)Vec_PtrEntry(vTables, 0) );
    vInd1   = Vec_FltDup( (Vec_Flt_t *)Vec_PtrEntry(vTables, 1) );
    vValues = Vec_FltDup( (Vec_Flt_t *)Vec_PtrEntry(vTables, 2) );
    for ( i = 1; i < nTriples; i++ )
    {
        vind0   = (Vec_Flt_t *)Vec_PtrEntry(vTables, i*3+0);
        vind1   = (Vec_Flt_t *)Vec_PtrEntry(vTables, i*3+1);
        vvalues = (Vec_Flt_t *)Vec_PtrEntry(vTables, i*3+2);
        // check equality of indexes
        if ( !Vec_FltEqual(vind0, vInd0) )
            continue;//return 0;
        if ( !Vec_FltEqual(vind1, vInd1) )
            continue;//return 0;
//        Vec_FltForEachEntry( vvalues, Entry, k )
//            Vec_FltAddToEntry( vValues, k, Entry );
        Vec_FltForEachEntry( vvalues, Entry, k )
            if ( Vec_FltEntry(vValues, k) < Entry )
                Vec_FltWriteEntry( vValues, k, Entry );
    }
//    Vec_FltForEachEntry( vValues, Entry, k )
//        Vec_FltWriteEntry( vValues, k, Entry/nTriples );
    // return the result
    *pvInd0 = vInd0;
    *pvInd1 = vInd1;
    *pvValues = vValues;
    return 1;
}